

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.cpp
# Opt level: O2

void __thiscall boost::deflate::detail::crc32_test::run(crc32_test *this)

{
  runner *prVar1;
  bool bVar2;
  anon_class_1_0_00000001 eq;
  
  prVar1 = test_suite::detail::current()::p;
  bVar2 = run::anon_class_1_0_00000001::operator()(&eq,"");
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar2,"eq(\"\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/crc32.cpp"
             ,0x1b,"void boost::deflate::detail::crc32_test::run()",(char *)0x0);
  prVar1 = test_suite::detail::current()::p;
  bVar2 = run::anon_class_1_0_00000001::operator()
                    (&eq,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_");
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar2,"eq(\"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_\")",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/crc32.cpp"
             ,0x1c,"void boost::deflate::detail::crc32_test::run()",(char *)0x0);
  prVar1 = test_suite::detail::current()::p;
  bVar2 = run::anon_class_1_0_00000001::operator()
                    (&eq,
                     "Lorem ipsum dolor sit amet, consectetur adipiscing elit. Donec vitae justo orci. Curabitur mattis venenatis tortor, et posuere dolor scelerisque quis. Proin in commodo ipsum. Aenean ullamcorper nibh non convallis rhoncus. Nam auctor, eros eget accumsan mollis, risus nulla commodo sapien, et accumsan eros nisl a leo. Nunc lobortis, nisi et consequat aliquam, justo purus ultrices ligula, non condimentum diam purus vitae tellus. Proin quis ullamcorper magna. Integer scelerisque metus nec justo ultricies ultricies. Sed purus urna, euismod quis nisi nec, porta finibus felis. Duis leo lacus, feugiat et malesuada ac, posuere ut metus. Vivamus dictum leo id semper posuere. Curabitur id nibh vel elit efficitur euismod sed vitae nulla. Proin erat mi, gravida at suscipit non, rhoncus vitae nibh. Maecenas cursus maximus leo eu tristique."
                    );
  test_suite::detail::runner::maybe_fail<bool>
            (prVar1,bVar2,
             "eq(\"Lorem ipsum dolor sit amet, consectetur adipiscing elit. Donec vitae justo orci.\" \" Curabitur mattis venenatis tortor, et posuere dolor scelerisque quis. Proin in \" \"commodo ipsum. Aenean ullamcorper nibh non convallis rhoncus. Nam auctor, eros e\" \"get accumsan mollis, risus nulla commodo sapien, et accumsan eros nisl a leo. Nu\" \"nc lobortis, nisi et consequat aliquam, justo purus ultrices ligula, non condime\" \"ntum diam purus vitae tellus. Proin quis ullamcorper magna. Integer scelerisque \" \"metus nec justo ultricies ultricies. Sed purus urna, euismod quis nisi nec, port\" \"a finibus felis. Duis leo lacus, feugiat et malesuada ac, posuere ut metus. Viva\" \"mus dictum leo id semper posuere. Curabitur id nibh vel elit efficitur euismod s\" \"ed vitae nulla. Proin erat mi, gravida at suscipit non, rhoncus vitae nibh. Maec\" \"enas cursus maximus leo eu tristique.\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/crc32.cpp"
             ,0x27,"void boost::deflate::detail::crc32_test::run()",(char *)0x0);
  return;
}

Assistant:

void run() {
            const auto eq = [](const char* data) {
              return crc32(reinterpret_cast<const unsigned char*>(data), std::strlen(data), crc32(nullptr, 0))
                     == ::crc32(::crc32(0, nullptr, 0), reinterpret_cast<const unsigned char*>(data), std::strlen(data));
            };
            BOOST_TEST(eq(""));
            BOOST_TEST(eq("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz_"));
            BOOST_TEST(eq("Lorem ipsum dolor sit amet, consectetur adipiscing elit. Donec vitae justo orci." \
                        " Curabitur mattis venenatis tortor, et posuere dolor scelerisque quis. Proin in " \
                        "commodo ipsum. Aenean ullamcorper nibh non convallis rhoncus. Nam auctor, eros e" \
                        "get accumsan mollis, risus nulla commodo sapien, et accumsan eros nisl a leo. Nu" \
                        "nc lobortis, nisi et consequat aliquam, justo purus ultrices ligula, non condime" \
                        "ntum diam purus vitae tellus. Proin quis ullamcorper magna. Integer scelerisque " \
                        "metus nec justo ultricies ultricies. Sed purus urna, euismod quis nisi nec, port" \
                        "a finibus felis. Duis leo lacus, feugiat et malesuada ac, posuere ut metus. Viva" \
                        "mus dictum leo id semper posuere. Curabitur id nibh vel elit efficitur euismod s" \
                        "ed vitae nulla. Proin erat mi, gravida at suscipit non, rhoncus vitae nibh. Maec" \
                        "enas cursus maximus leo eu tristique."));


        }